

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::_InternalSerialize
          (TensorValue_RepeatedStrings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *s_00;
  char *data;
  size_t __n;
  void *pvVar5;
  void *__dest;
  string *s;
  int local_70;
  int n;
  int i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TensorValue_RepeatedStrings *this_local;
  ptrdiff_t size;
  EpsCopyOutputStream *local_28;
  
  local_70 = 0;
  iVar3 = _internal_values_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_70 < iVar3; local_70 = local_70 + 1) {
    s_00 = _internal_values_abi_cxx11_(this,local_70);
    data = (char *)std::__cxx11::string::data();
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,iVar4,SERIALIZE,
               "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    __n = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)__n < 0x80) {
      puVar1 = stream->end_;
      iVar4 = google::protobuf::io::EpsCopyOutputStream::TagSize(8);
      bVar2 = (long)(puVar1 + (-(long)iVar4 - (long)stream_local) + 0xf) < (long)__n;
    }
    if (bVar2) {
      local_28 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,1,s_00,(uint8_t *)stream_local);
    }
    else {
      *(undefined1 *)&stream_local->end_ = 10;
      __dest = (void *)((long)&stream_local->end_ + 2);
      *(char *)((long)&stream_local->end_ + 1) = (char)__n;
      pvVar5 = (void *)std::__cxx11::string::data();
      memcpy(__dest,pvVar5,__n);
      local_28 = (EpsCopyOutputStream *)((long)__dest + __n);
    }
    stream_local = local_28;
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    pvVar5 = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,pvVar5,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* TensorValue_RepeatedStrings::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string values = 1;
  for (int i = 0, n = this->_internal_values_size(); i < n; i++) {
    const auto& s = this->_internal_values(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    target = stream->WriteString(1, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  return target;
}